

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_BuildAgainWithSyntax_Test::TestBody
          (FileDescriptorTest_BuildAgainWithSyntax_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_500;
  Message local_4f8;
  FileDescriptor *local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_4b8;
  Message local_4b0;
  bool local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar__2;
  FileDescriptor *proto3_descriptor;
  FileDescriptorProto proto_syntax3;
  Message local_388;
  FileDescriptor *local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__1;
  FileDescriptor *implicit_proto2_descriptor;
  FileDescriptorProto implicit_proto2;
  Message local_218;
  FileDescriptor *local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_;
  FileDescriptor *proto2_descriptor;
  undefined1 local_198 [8];
  FileDescriptorProto proto_syntax2;
  FileDescriptorTest_BuildAgainWithSyntax_Test *this_local;
  
  proto_syntax2.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_198);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &proto_syntax2.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &proto_syntax2.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
             "foo_syntax2",pAVar3);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &proto_syntax2.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
  internal::ArenaStringPtr::Set(&proto_syntax2.field_0._impl_.package_,"proto2",pAVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )DescriptorPool::BuildFile
                   (&(this->super_FileDescriptorTest).pool_,(FileDescriptorProto *)local_198);
  local_1c1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_1c0,(AssertionResult *)0x1cee49b,
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1db,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_210 = DescriptorPool::BuildFile
                        (&(this->super_FileDescriptorTest).pool_,(FileDescriptorProto *)local_198);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_nullptr>
            ((EqHelper *)local_208,"proto2_descriptor","pool_.BuildFile(proto_syntax2)",
             (FileDescriptor **)&gtest_ar_.message_,&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&implicit_proto2.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1dc,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&implicit_proto2.field_0 + 0xe0),&local_218);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&implicit_proto2.field_0 + 0xe0));
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&implicit_proto2_descriptor);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &implicit_proto2.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)&implicit_proto2_descriptor);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &implicit_proto2.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
             "foo_implicit_syntax2",pAVar3);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )DescriptorPool::BuildFile
                   (&(this->super_FileDescriptorTest).pool_,
                    (FileDescriptorProto *)&implicit_proto2_descriptor);
  local_331 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_330,
               (AssertionResult *)"implicit_proto2_descriptor != nullptr","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1e3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &implicit_proto2.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)&implicit_proto2_descriptor);
  internal::ArenaStringPtr::Set(&implicit_proto2.field_0._impl_.package_,"proto2",pAVar3);
  local_380 = DescriptorPool::BuildFile
                        (&(this->super_FileDescriptorTest).pool_,
                         (FileDescriptorProto *)&implicit_proto2_descriptor);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_nullptr>
            ((EqHelper *)local_378,"implicit_proto2_descriptor","pool_.BuildFile(implicit_proto2)",
             (FileDescriptor **)&gtest_ar__1.message_,&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&proto_syntax3.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1e7,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&proto_syntax3.field_0 + 0xe0),&local_388);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&proto_syntax3.field_0 + 0xe0));
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&proto3_descriptor);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &proto_syntax3.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)&proto3_descriptor);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &proto_syntax3.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
             "foo_syntax3",pAVar3);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &proto_syntax3.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)&proto3_descriptor);
  internal::ArenaStringPtr::Set(&proto_syntax3.field_0._impl_.package_,"proto3",pAVar3);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )DescriptorPool::BuildFile
                   (&(this->super_FileDescriptorTest).pool_,
                    (FileDescriptorProto *)&proto3_descriptor);
  local_4a1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar__2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a0,&local_4a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_4a0,
               (AssertionResult *)"proto3_descriptor != nullptr","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ee,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  local_4f0 = DescriptorPool::BuildFile
                        (&(this->super_FileDescriptorTest).pool_,
                         (FileDescriptorProto *)&proto3_descriptor);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_nullptr>
            ((EqHelper *)local_4e8,"proto3_descriptor","pool_.BuildFile(proto_syntax3)",
             (FileDescriptor **)&gtest_ar__2.message_,&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ef,pcVar4);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&proto3_descriptor);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&implicit_proto2_descriptor);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_198);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, BuildAgainWithSyntax) {
  // Test that if we call BuildFile again on the same input we get the same
  // FileDescriptor back even if syntax param is specified.
  FileDescriptorProto proto_syntax2;
  proto_syntax2.set_name("foo_syntax2");
  proto_syntax2.set_syntax("proto2");

  const FileDescriptor* proto2_descriptor = pool_.BuildFile(proto_syntax2);
  EXPECT_TRUE(proto2_descriptor != nullptr);
  EXPECT_EQ(proto2_descriptor, pool_.BuildFile(proto_syntax2));

  FileDescriptorProto implicit_proto2;
  implicit_proto2.set_name("foo_implicit_syntax2");

  const FileDescriptor* implicit_proto2_descriptor =
      pool_.BuildFile(implicit_proto2);
  EXPECT_TRUE(implicit_proto2_descriptor != nullptr);
  // We get the same FileDescriptor back if syntax param is explicitly
  // specified.
  implicit_proto2.set_syntax("proto2");
  EXPECT_EQ(implicit_proto2_descriptor, pool_.BuildFile(implicit_proto2));

  FileDescriptorProto proto_syntax3;
  proto_syntax3.set_name("foo_syntax3");
  proto_syntax3.set_syntax("proto3");

  const FileDescriptor* proto3_descriptor = pool_.BuildFile(proto_syntax3);
  EXPECT_TRUE(proto3_descriptor != nullptr);
  EXPECT_EQ(proto3_descriptor, pool_.BuildFile(proto_syntax3));
}